

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallFileGenerator::GenerateImportPrefix(cmExportInstallFileGenerator *this,ostream *os)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *in_name;
  string absDestS;
  string absDest;
  string dest;
  string installPrefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  string local_40;
  
  this_00 = this->IEGen->LocalGenerator->Makefile;
  std::__cxx11::string::string((string *)&local_c0,"CMAKE_INSTALL_PREFIX",(allocator *)&local_e0);
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,&local_c0);
  std::__cxx11::string::string((string *)&local_80,pcVar2,(allocator *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  in_name = &(this->IEGen->super_cmInstallGenerator).Destination;
  bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
  if (bVar1) {
    poVar3 = std::operator<<(os,
                             "# The installation prefix configured by this project.\nset(_IMPORT_PREFIX \""
                            );
    poVar3 = std::operator<<(poVar3,(string *)&local_80);
    std::operator<<(poVar3,"\")\n\n");
    goto LAB_0040c8eb;
  }
  std::operator+(&local_e0,&local_80,"/");
  std::operator+(&local_c0,&local_e0,in_name);
  std::__cxx11::string::~string((string *)&local_e0);
  std::operator+(&local_e0,&local_c0,"/");
  poVar3 = std::operator<<(os,"# Compute the installation prefix relative to this file.\n");
  poVar3 = std::operator<<(poVar3,"get_filename_component(_IMPORT_PREFIX");
  std::operator<<(poVar3," \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n");
  local_a0._M_dataplus._M_p = local_e0._M_dataplus._M_p;
  bVar1 = cmHasLiteralPrefix<char_const*,6ul>((char **)&local_a0,(char (*) [6])0x5363fd);
  if (bVar1) {
LAB_0040c7f6:
    poVar3 = std::operator<<(os,
                             "# Use original install prefix when loaded through a\n# cross-prefix symbolic link such as /lib -> /usr/lib.\nget_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\nget_filename_component(_realOrig \""
                            );
    poVar3 = std::operator<<(poVar3,(string *)&local_c0);
    poVar3 = std::operator<<(poVar3,
                             "\" REALPATH)\nif(_realCurr STREQUAL _realOrig)\n  set(_IMPORT_PREFIX \""
                            );
    poVar3 = std::operator<<(poVar3,(string *)&local_c0);
    std::operator<<(poVar3,"\")\nendif()\nunset(_realOrig)\nunset(_realCurr)\n");
  }
  else {
    local_40._M_dataplus._M_p = local_e0._M_dataplus._M_p;
    bVar1 = cmHasLiteralPrefix<char_const*,8ul>((char **)&local_40,(char (*) [8])0x536407);
    if (bVar1) goto LAB_0040c7f6;
    local_48 = local_e0._M_dataplus._M_p;
    bVar1 = cmHasLiteralPrefix<char_const*,9ul>(&local_48,(char (*) [9])0x536413);
    if (bVar1) goto LAB_0040c7f6;
    local_50 = local_e0._M_dataplus._M_p;
    bVar1 = cmHasLiteralPrefix<char_const*,10ul>(&local_50,(char (*) [10])"/usr/lib/");
    if (bVar1) goto LAB_0040c7f6;
    local_58 = local_e0._M_dataplus._M_p;
    bVar1 = cmHasLiteralPrefix<char_const*,12ul>(&local_58,(char (*) [12])"/usr/lib64/");
    if (bVar1) goto LAB_0040c7f6;
    local_60 = local_e0._M_dataplus._M_p;
    bVar1 = cmHasLiteralPrefix<char_const*,13ul>(&local_60,(char (*) [13])"/usr/libx32/");
    if (bVar1) goto LAB_0040c7f6;
  }
  std::__cxx11::string::string((string *)&local_a0,(string *)in_name);
  while (local_a0._M_string_length != 0) {
    std::operator<<(os,"get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n");
    cmsys::SystemTools::GetFilenamePath(&local_40,&local_a0);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar3 = std::operator<<(os,"if(_IMPORT_PREFIX STREQUAL \"/\")\n");
  poVar3 = std::operator<<(poVar3,"  set(_IMPORT_PREFIX \"\")\n");
  poVar3 = std::operator<<(poVar3,"endif()\n");
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
LAB_0040c8eb:
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void cmExportInstallFileGenerator::GenerateImportPrefix(std::ostream& os)
{
  // Set an _IMPORT_PREFIX variable for import location properties
  // to reference if they are relative to the install prefix.
  std::string installPrefix =
    this->IEGen->GetLocalGenerator()->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_PREFIX");
  std::string const& expDest = this->IEGen->GetDestination();
  if (cmSystemTools::FileIsFullPath(expDest)) {
    // The export file is being installed to an absolute path so the
    // package is not relocatable.  Use the configured install prefix.
    /* clang-format off */
    os <<
      "# The installation prefix configured by this project.\n"
      "set(_IMPORT_PREFIX \"" << installPrefix << "\")\n"
      "\n";
    /* clang-format on */
  } else {
    // Add code to compute the installation prefix relative to the
    // import file location.
    std::string absDest = installPrefix + "/" + expDest;
    std::string absDestS = absDest + "/";
    os << "# Compute the installation prefix relative to this file.\n"
       << "get_filename_component(_IMPORT_PREFIX"
       << " \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n";
    if (cmHasLiteralPrefix(absDestS.c_str(), "/lib/") ||
        cmHasLiteralPrefix(absDestS.c_str(), "/lib64/") ||
        cmHasLiteralPrefix(absDestS.c_str(), "/libx32/") ||
        cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib/") ||
        cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib64/") ||
        cmHasLiteralPrefix(absDestS.c_str(), "/usr/libx32/")) {
      // Handle "/usr move" symlinks created by some Linux distros.
      /* clang-format off */
      os <<
        "# Use original install prefix when loaded through a\n"
        "# cross-prefix symbolic link such as /lib -> /usr/lib.\n"
        "get_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\n"
        "get_filename_component(_realOrig \"" << absDest << "\" REALPATH)\n"
        "if(_realCurr STREQUAL _realOrig)\n"
        "  set(_IMPORT_PREFIX \"" << absDest << "\")\n"
        "endif()\n"
        "unset(_realOrig)\n"
        "unset(_realCurr)\n";
      /* clang-format on */
    }
    std::string dest = expDest;
    while (!dest.empty()) {
      os << "get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" "
            "PATH)\n";
      dest = cmSystemTools::GetFilenamePath(dest);
    }
    os << "if(_IMPORT_PREFIX STREQUAL \"/\")\n"
       << "  set(_IMPORT_PREFIX \"\")\n"
       << "endif()\n"
       << "\n";
  }
}